

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToUniASCII::map(CCharmapToUniASCII *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  wchar_t ch;
  size_t sVar4;
  ulong uVar5;
  
  sVar4 = 0;
  for (sVar3 = 0; inlen != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = inp[sVar3];
    ch = (wchar_t)bVar1;
    if (-1 >= (char)bVar1) {
      ch = L'�';
    }
    uVar5 = (ulong)(-1 < (char)bVar1) ^ 3;
    if ((uint)ch < 0x80) {
      uVar5 = 1;
    }
    if (*outlen < uVar5) {
      sVar2 = 0;
    }
    else {
      sVar2 = utf8_ptr::s_putch(*outp,ch);
      *outp = *outp + sVar2;
      sVar2 = *outlen - uVar5;
    }
    sVar4 = sVar4 + uVar5;
    *outlen = sVar2;
  }
  return sVar4;
}

Assistant:

size_t CCharmapToUniASCII::map(char **outp, size_t *outlen,
                               const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte) in the input string */
    for ( ; inlen > 0 ; --inlen, ++inp)
    {
        wchar_t uni;
        size_t csiz;

        /* 
         *   map any character outside of the 7-bit range to U+FFFD, the
         *   Unicode REPLACEMENT CHARACTER, which is the standard way to
         *   represent characters that can't be mapped from an incoming
         *   character set 
         */
        if (((unsigned char)*inp) > 127)
            uni = 0xfffd;
        else
            uni = ((wchar_t)(unsigned char)*inp);

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output length */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);

            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}